

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfCase.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::IfCase::dump_abi_cxx11_
          (string *__return_storage_ptr__,IfCase *this,int level)

{
  Expression *pEVar1;
  Block *pBVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)level);
  std::operator+(&bStack_218,&local_1f8,"IfCase ");
  poVar3 = std::operator<<(local_1a8,(string *)&bStack_218);
  pEVar1 = (this->condition)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pEVar1->super_Statement).super_ASTElement + 0x18))
            (local_1d8,pEVar1,level + 1);
  poVar3 = std::operator<<(poVar3,local_1d8);
  poVar3 = std::operator<<(poVar3," {");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string((string *)&bStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  pBVar2 = (this->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar2->super_Expression).super_Statement + 0x18))
            (&bStack_218,pBVar2,level + 1);
  poVar3 = std::operator<<(local_1a8,(string *)&bStack_218);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&bStack_218);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)level);
  std::operator+(&bStack_218,&local_1f8,"}");
  poVar3 = std::operator<<(local_1a8,(string *)&bStack_218);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&bStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::IfCase::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "IfCase " << this->condition->dump(level+1) << " {" << std::endl;
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}